

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventloop.c
# Opt level: O0

void aura_eventloop_add(aura_eventloop *loop,aura_node *node)

{
  list_head *plVar1;
  aura_eventloop *loop_00;
  list_head *__mptr_1;
  list_head *__mptr;
  aura_timer *pos;
  aura_eventloop *curloop;
  aura_node *node_local;
  aura_eventloop *loop_local;
  
  loop_00 = aura_node_eventloop_get(node);
  if ((loop_00 != (aura_eventloop *)0x0) && (node->evtloop_is_autocreated == 0)) {
    BUG(node,"Specified node is already bound to an event-system");
  }
  if (loop_00 != (aura_eventloop *)0x0) {
    slog(4,4,"eventloop: Node has an associated auto-created eventsystem, destroying...");
    aura_eventloop_destroy(loop_00);
  }
  list_add_tail(&node->eventloop_node_list,&loop->nodelist);
  aura_node_eventloop_set(node,loop);
  (*loop->module->node_added)(loop,node);
  aura_fd_changed_cb(node,eventloop_fd_changed_cb,loop);
  for (plVar1 = (node->timer_list).next; __mptr = plVar1 + -1, plVar1 != &node->timer_list;
      plVar1 = plVar1->next) {
    if (((ulong)plVar1[2].prev & 0x100000000) != 0) {
      *(undefined1 *)((long)&plVar1[2].prev + 4) = 0;
      aura_timer_start((aura_timer *)__mptr,*(int *)&plVar1[2].prev,(timeval *)0x0);
    }
  }
  return;
}

Assistant:

void aura_eventloop_add(struct aura_eventloop *loop, struct aura_node *node)
{
	struct aura_eventloop *curloop = aura_node_eventloop_get(node);
	struct aura_timer *pos;

	/* Some sanity checking first */
	if ((curloop != NULL) && (!node->evtloop_is_autocreated))
		BUG(node, "Specified node is already bound to an event-system");

	if (curloop != NULL) {
		slog(4, SLOG_DEBUG, "eventloop: Node has an associated auto-created eventsystem, destroying...");
		aura_eventloop_destroy(curloop);
	}

	/* Link our next node into our list and adjust timeouts */
	list_add_tail(&node->eventloop_node_list, &loop->nodelist);
	aura_node_eventloop_set(node, loop);

	loop->module->node_added(loop, node);

	/* Set up our fdaction callback to handle descriptor changes */
	aura_fd_changed_cb(node, eventloop_fd_changed_cb, loop);

	/* Start all node's timers, if any */
	list_for_each_entry(pos, &node->timer_list, entry) {
		if (pos->is_active) {
			pos->is_active = false;
			aura_timer_start(pos, pos->flags, NULL);
		}
	}
}